

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<const_kj::File,_std::nullptr_t> __thiscall
kj::Directory::openFile(Directory *this,PathPtr path,WriteMode mode)

{
  bool bVar1;
  Own<const_kj::File,_std::nullptr_t> *pOVar2;
  Clock *clock;
  undefined4 in_register_0000000c;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *pFVar3;
  WriteMode in_R8D;
  Own<const_kj::File,_std::nullptr_t> OVar4;
  undefined1 local_b8 [24];
  Fault f_4;
  Fault f_3;
  Fault f_2;
  Fault f_1;
  Own<const_kj::File,_std::nullptr_t> *f;
  Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> local_50;
  undefined1 local_40 [8];
  OwnOwn<const_kj::File,_std::nullptr_t> _f579;
  WriteMode mode_local;
  Directory *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)CONCAT44(in_register_0000000c,mode);
  this_local = (Directory *)path.parts.size_;
  _f579.value.ptr._4_4_ = in_R8D;
  path_local.parts.size_ = (size_t)this;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x68))
            (&local_50,path.parts.ptr,this_local,CONCAT44(in_register_0000000c,mode),in_R8D);
  kj::_::readMaybe<kj::File_const,decltype(nullptr)>((_ *)local_40,&local_50);
  Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>::~Maybe(&local_50);
  pOVar2 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_40);
  if (pOVar2 == (Own<const_kj::File,_std::nullptr_t> *)0x0) {
    bVar1 = has<kj::WriteMode,void>(_f579.value.ptr._4_4_,CREATE);
    if ((!bVar1) || (bVar1 = has<kj::WriteMode,void>(_f579.value.ptr._4_4_,MODIFY), bVar1)) {
      bVar1 = has<kj::WriteMode,void>(_f579.value.ptr._4_4_,MODIFY);
      if ((!bVar1) || (bVar1 = has<kj::WriteMode,void>(_f579.value.ptr._4_4_,CREATE), bVar1)) {
        bVar1 = has<kj::WriteMode,void>(_f579.value.ptr._4_4_,MODIFY);
        if ((bVar1) || (bVar1 = has<kj::WriteMode,void>(_f579.value.ptr._4_4_,CREATE), bVar1)) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53],kj::PathPtr&>
                    ((Fault *)(local_b8 + 0x10),
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x24d,FAILED,(char *)0x0,
                     "\"tryOpenFile() returned null despite no preconditions\", path",
                     (char (*) [53])"tryOpenFile() returned null despite no preconditions",
                     (PathPtr *)&this_local);
          kj::_::Debug::Fault::~Fault((Fault *)(local_b8 + 0x10));
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58],kj::PathPtr&>
                    (&f_4,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x24a,FAILED,(char *)0x0,
                     "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\", path",
                     (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given",
                     (PathPtr *)&this_local);
          kj::_::Debug::Fault::~Fault(&f_4);
        }
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x248,FAILED,(char *)0x0,"\"file does not exist\", path",
                   (char (*) [20])"file does not exist",(PathPtr *)&this_local);
        kj::_::Debug::Fault::~Fault(&f_3);
      }
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                (&f_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x246,FAILED,(char *)0x0,"\"file already exists\", path",
                 (char (*) [20])"file already exists",(PathPtr *)&this_local);
      kj::_::Debug::Fault::~Fault(&f_2);
    }
    bVar1 = false;
  }
  else {
    pOVar2 = kj::_::OwnOwn<const_kj::File,_std::nullptr_t>::operator*
                       ((OwnOwn<const_kj::File,_std::nullptr_t> *)local_40);
    pOVar2 = mv<kj::Own<kj::File_const,decltype(nullptr)>>(pOVar2);
    Own<const_kj::File,_std::nullptr_t>::Own((Own<const_kj::File,_std::nullptr_t> *)this,pOVar2);
    bVar1 = true;
  }
  kj::_::OwnOwn<const_kj::File,_std::nullptr_t>::~OwnOwn
            ((OwnOwn<const_kj::File,_std::nullptr_t> *)local_40);
  pFVar3 = extraout_RDX;
  if (!bVar1) {
    clock = nullClock();
    newInMemoryFile((kj *)local_b8,clock);
    Own<const_kj::File,_std::nullptr_t>::Own
              ((Own<const_kj::File,_std::nullptr_t> *)this,(Own<kj::File,_std::nullptr_t> *)local_b8
              );
    Own<kj::File,_std::nullptr_t>::~Own((Own<kj::File,_std::nullptr_t> *)local_b8);
    pFVar3 = extraout_RDX_00;
  }
  OVar4.ptr = pFVar3;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

Own<const File> Directory::openFile(PathPtr path, WriteMode mode) const {
  KJ_IF_SOME(f, tryOpenFile(path, mode)) {
    return kj::mv(f);
  } else if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("file already exists", path) { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("file does not exist", path) { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given", path) { break; }
  } else {
    // Shouldn't happen.
    KJ_FAIL_ASSERT("tryOpenFile() returned null despite no preconditions", path) { break; }